

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O2

void socks_cf_adjust_pollset(Curl_cfilter *cf,Curl_easy *data,easy_pollset *ps)

{
  uint uVar1;
  uint *puVar2;
  curl_socket_t sock;
  int add_flags;
  int iStack_20;
  
  puVar2 = (uint *)cf->ctx;
  if (puVar2 != (uint *)0x0 && (cf->field_0x24 & 1) == 0) {
    sock = Curl_conn_cf_get_socket(cf,data);
    uVar1 = *puVar2;
    if ((uVar1 < 0x11) && ((0x18510U >> (uVar1 & 0x1f) & 1) != 0)) {
      add_flags = 1;
      iStack_20 = 2;
    }
    else {
      add_flags = 2;
      iStack_20 = 1;
    }
    Curl_pollset_change(data,ps,sock,add_flags,iStack_20);
    return;
  }
  return;
}

Assistant:

static void socks_cf_adjust_pollset(struct Curl_cfilter *cf,
                                     struct Curl_easy *data,
                                     struct easy_pollset *ps)
{
  struct socks_state *sx = cf->ctx;

  if(!cf->connected && sx) {
    /* If we are not connected, the filter below is and has nothing
     * to wait on, we determine what to wait for. */
    curl_socket_t sock = Curl_conn_cf_get_socket(cf, data);
    switch(sx->state) {
    case CONNECT_RESOLVING:
    case CONNECT_SOCKS_READ:
    case CONNECT_AUTH_READ:
    case CONNECT_REQ_READ:
    case CONNECT_REQ_READ_MORE:
      Curl_pollset_set_in_only(data, ps, sock);
      break;
    default:
      Curl_pollset_set_out_only(data, ps, sock);
      break;
    }
  }
}